

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O3

void __thiscall Cache::setByte(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  pointer pBVar3;
  bool bVar4;
  uint32_t uVar5;
  byte bVar6;
  byte bVar7;
  Block *b;
  uint uVar8;
  Cache *this_00;
  Cache *this_01;
  ulong uVar9;
  
  while( true ) {
    this_00 = this;
    this_00->referenceCounter = this_00->referenceCounter + 1;
    puVar1 = &(this_00->statistics).numWrite;
    *puVar1 = *puVar1 + 1;
    uVar5 = getBlockId(this_00,addr);
    if (uVar5 != 0xffffffff) {
      uVar8 = (this_00->policy).blockSize;
      bVar6 = 0xff;
      if (uVar8 != 0) {
        bVar7 = 0;
        bVar6 = 0;
        if (uVar8 != 1) {
          do {
            bVar6 = bVar7 + 1;
            bVar4 = 3 < uVar8;
            uVar8 = uVar8 >> 1;
            bVar7 = bVar6;
          } while (bVar4);
        }
      }
      puVar1 = &(this_00->statistics).numHit;
      *puVar1 = *puVar1 + 1;
      puVar2 = &(this_00->statistics).totalCycles;
      *puVar2 = *puVar2 + (ulong)(this_00->policy).hitLatency;
      pBVar3 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar3[(int)uVar5].modified = true;
      pBVar3[(int)uVar5].lastReference = this_00->referenceCounter;
      *(uint8_t *)
       (*(long *)&pBVar3[(int)uVar5].data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + (ulong)(~(-1 << (bVar6 & 0x1f)) & addr)) = val;
      if (this_00->writeBack == false) {
        writeBlockToLowerLevel
                  (this_00,(this_00->blocks).
                           super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                           super__Vector_impl_data._M_start + (int)uVar5);
        puVar2 = &(this_00->statistics).totalCycles;
        *puVar2 = *puVar2 + (ulong)(this_00->policy).missLatency;
      }
      if (cycles != (uint32_t *)0x0) {
        *cycles = (this_00->policy).hitLatency;
      }
      return;
    }
    puVar1 = &(this_00->statistics).numMiss;
    *puVar1 = *puVar1 + 1;
    puVar2 = &(this_00->statistics).totalCycles;
    *puVar2 = *puVar2 + (ulong)(this_00->policy).missLatency;
    if (this_00->writeAllocate == true) break;
    cycles = (uint32_t *)0x0;
    this = this_00->lowerCache;
    if (this_00->lowerCache == (Cache *)0x0) {
      MemoryManager::setByteNoCache(this_00->memory,addr,val);
      return;
    }
  }
  loadBlockFromLowerLevel(this_00,addr,cycles);
  b = (Block *)(ulong)addr;
  this_01 = this_00;
  uVar5 = getBlockId(this_00,addr);
  if (uVar5 != 0xffffffff) {
    uVar8 = (this_00->policy).blockSize;
    bVar6 = 0xff;
    if (uVar8 != 0) {
      bVar7 = 0;
      bVar6 = 0;
      if (uVar8 != 1) {
        do {
          bVar6 = bVar7 + 1;
          bVar4 = 3 < uVar8;
          uVar8 = uVar8 >> 1;
          bVar7 = bVar6;
        } while (bVar4);
      }
    }
    pBVar3 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar3[(int)uVar5].modified = true;
    pBVar3[(int)uVar5].lastReference = this_00->referenceCounter;
    *(uint8_t *)
     (*(long *)&pBVar3[(int)uVar5].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)(~(-1 << (bVar6 & 0x1f)) & addr)) = val;
    return;
  }
  setByte();
  uVar5 = getAddr(this_01,b);
  if (this_01->lowerCache == (Cache *)0x0) {
    if (b->size != 0) {
      uVar9 = 0;
      do {
        MemoryManager::setByteNoCache
                  (this_01->memory,uVar5 + (int)uVar9,
                   (b->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar9]);
        uVar9 = uVar9 + 1;
      } while (uVar9 < b->size);
    }
  }
  else if (b->size != 0) {
    uVar9 = 0;
    do {
      setByte(this_01->lowerCache,uVar5 + (int)uVar9,
              (b->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9],(uint32_t *)0x0);
      uVar9 = uVar9 + 1;
    } while (uVar9 < b->size);
  }
  return;
}

Assistant:

void Cache::setByte(uint32_t addr, uint8_t val, uint32_t *cycles) {
  this->referenceCounter++;
  this->statistics.numWrite++;

  // If in cache, write to it directly
  int blockId;
  if ((blockId = this->getBlockId(addr)) != -1) {
    uint32_t offset = this->getOffset(addr);
    this->statistics.numHit++;
    this->statistics.totalCycles += this->policy.hitLatency;
    this->blocks[blockId].modified = true;
    this->blocks[blockId].lastReference = this->referenceCounter;
    this->blocks[blockId].data[offset] = val;
    if (!this->writeBack) {
      this->writeBlockToLowerLevel(this->blocks[blockId]);
      this->statistics.totalCycles += this->policy.missLatency;
    }
    if (cycles) *cycles = this->policy.hitLatency;
    return;
  }

  // Else, load the data from cache
  // TODO: implement bypassing
  this->statistics.numMiss++;
  this->statistics.totalCycles += this->policy.missLatency;

  if (this->writeAllocate) {
    this->loadBlockFromLowerLevel(addr, cycles);

    if ((blockId = this->getBlockId(addr)) != -1) {
      uint32_t offset = this->getOffset(addr);
      this->blocks[blockId].modified = true;
      this->blocks[blockId].lastReference = this->referenceCounter;
      this->blocks[blockId].data[offset] = val;
      return;
    } else {
      fprintf(stderr, "Error: data not in top level cache!\n");
      exit(-1);
    }
  } else {
    if (this->lowerCache == nullptr) {
      this->memory->setByteNoCache(addr, val);
    } else {
      this->lowerCache->setByte(addr, val);
    }
  }
}